

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

CBNode * __thiscall asmjit::CodeBuilder::addNode(CodeBuilder *this,CBNode *node)

{
  CBNode *pCVar1;
  CBNode *pCVar2;
  
  if (node == (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x117,"node");
  }
  if (node->_prev != (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x118,"node->_prev == nullptr");
  }
  if (node->_next != (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x119,"node->_next == nullptr");
  }
  pCVar2 = this->_cursor;
  if (pCVar2 == (CBNode *)0x0) {
    pCVar2 = this->_firstNode;
    if (pCVar2 == (CBNode *)0x0) {
      this->_firstNode = node;
      pCVar2 = (CBNode *)&this->_lastNode;
    }
    else {
      node->_next = pCVar2;
      pCVar2->_prev = node;
      pCVar2 = (CBNode *)&this->_firstNode;
    }
  }
  else {
    pCVar1 = pCVar2->_next;
    node->_prev = pCVar2;
    node->_next = pCVar1;
    pCVar2->_next = node;
    pCVar2 = (CBNode *)&this->_lastNode;
    if (pCVar1 != (CBNode *)0x0) {
      pCVar2 = pCVar1;
    }
  }
  pCVar2->_prev = node;
  this->_cursor = node;
  return node;
}

Assistant:

CBNode* CodeBuilder::addNode(CBNode* node) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);

  if (!_cursor) {
    if (!_firstNode) {
      _firstNode = node;
      _lastNode = node;
    }
    else {
      node->_next = _firstNode;
      _firstNode->_prev = node;
      _firstNode = node;
    }
  }
  else {
    CBNode* prev = _cursor;
    CBNode* next = _cursor->_next;

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _lastNode = node;
  }

  _cursor = node;
  return node;
}